

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

void JsStandardDelete(JsObject *self,char *prop,JsValue *res)

{
  JsStandardSelfBlock *sb_00;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  JsStandardSelfBlock *sb;
  JsProperty *p;
  int size;
  int i;
  JsValue *res_local;
  char *prop_local;
  JsObject *self_local;
  
  res->type = JS_BOOLEAN;
  sb_00 = (JsStandardSelfBlock *)*self->sb;
  JsLockup(sb_00->lock);
  iVar1 = JsListSize(sb_00->propertys);
  p._4_4_ = 0;
  while( true ) {
    if (iVar1 <= p._4_4_) {
      JsUnlock(sb_00->lock);
      (res->u).boolean = 1;
      return;
    }
    puVar3 = (undefined8 *)JsListGet(sb_00->propertys,p._4_4_);
    iVar2 = strcmp((char *)*puVar3,prop);
    if (iVar2 == 0) break;
    p._4_4_ = p._4_4_ + 1;
  }
  if ((*(uint *)(puVar3 + 2) & 4) != 0) {
    JsUnlock(sb_00->lock);
    (res->u).boolean = 0;
    return;
  }
  JsListRemove(sb_00->propertys,p._4_4_);
  noticeDel(sb_00);
  JsUnlock(sb_00->lock);
  (res->u).boolean = 1;
  return;
}

Assistant:

void JsStandardDelete(struct JsObject *self, char *prop,struct JsValue* res){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	res->type = JS_BOOLEAN;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	JsLockup(sb->lock);
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			if(p->attr & JS_OBJECT_ATTR_DONTDELETE){
				JsUnlock(sb->lock);
				res->u.boolean = FALSE;
				return;
			}
			//删除该属性
			JsListRemove(sb->propertys,i);
			//对Iterator做处理
			noticeDel(sb);
			//解锁
			JsUnlock(sb->lock);
			res->u.boolean = TRUE;
			return;
		}
	}
	JsUnlock(sb->lock);	
	res->u.boolean = TRUE;
	return;
}